

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_stack.c
# Opt level: O2

DsStack * ds_stack_create(size_t size)

{
  DsStack *pDVar1;
  void **ppvVar2;
  size_t sVar3;
  
  pDVar1 = (DsStack *)calloc(1,0x18);
  ppvVar2 = (void **)malloc(8);
  pDVar1->elems = ppvVar2;
  if (ppvVar2 != (void **)0x0) {
    sVar3 = 0x10;
    if (size != 0) {
      sVar3 = size;
    }
    pDVar1->max = sVar3;
    pDVar1->index = 0;
    return pDVar1;
  }
  exit(2);
}

Assistant:

DsStack *ds_stack_create(size_t size)
{
    DsStack *stack = (DsStack *)malloc(sizeof(DsStack));
    memset(stack, 0, sizeof(DsStack));
    if (NULL == stack)
        exit(DS_STATUS_OUTMEM);
    if (size <= 0)
        size = 16;
    stack->elems = (void **)malloc(sizeof(void **));
    if (NULL == stack->elems)
        exit(DS_STATUS_OUTMEM);
    stack->max = size;
    stack->index = 0;
    return stack;
}